

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall ghc::filesystem::path::iterator::updateCurrent(iterator *this)

{
  path *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  char *pcVar1;
  ulong uVar2;
  const_iterator last;
  
  first._M_current = (this->_iter)._M_current;
  if (((first._M_current != (this->_first)._M_current) &&
      (pcVar1 = (this->_last)._M_current, first._M_current != pcVar1)) &&
     ((first._M_current + 1 == pcVar1 && first._M_current != (this->_root)._M_current) &&
      *first._M_current == '/')) {
    assign<char[1]>(&this->_current,(char (*) [1])0x17e102);
    return;
  }
  this_00 = &this->_current;
  last = increment(this,&this->_iter);
  assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (this_00,first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )last._M_current);
  uVar2 = (this->_current)._path._M_string_length;
  if (((1 < uVar2) && (pcVar1 = (this_00->_path)._M_dataplus._M_p, *pcVar1 == '/')) &&
     (pcVar1[uVar2 - 1] == '/')) {
    assign<char[2]>(this_00,(char (*) [2])"/");
    return;
  }
  return;
}

Assistant:

GHC_INLINE void path::iterator::updateCurrent()
{
    if (_iter != _first && _iter != _last && (*_iter == '/' && _iter != _root) && (_iter + 1 == _last)) {
        _current = "";
    }
    else {
        _current.assign(_iter, increment(_iter));
        if (_current.generic_string().size() > 1 && _current.generic_string()[0] == '/' && _current.generic_string()[_current.generic_string().size() - 1] == '/') {
            // shrink successive slashes to one
            _current = "/";
        }
    }
}